

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O2

int __thiscall efsw::DirectorySnapshot::init(DirectorySnapshot *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)ctx);
  setDirectoryInfo(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  initFiles(this);
  return extraout_EAX;
}

Assistant:

void DirectorySnapshot::init( std::string directory ) {
	setDirectoryInfo( directory );
	initFiles();
}